

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O2

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::SafeReleaseResource
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          DynamicStaleResourceWrapper *Wrapper,Uint64 NextCommandListNumber)

{
  Uint64 local_28;
  
  local_28 = NextCommandListNumber;
  std::mutex::lock(&this->m_StaleObjectsMutex);
  std::
  deque<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::STDAllocator<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::IMemoryAllocator>>
  ::emplace_back<unsigned_long&,Diligent::DynamicStaleResourceWrapper_const&>
            ((deque<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::STDAllocator<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::IMemoryAllocator>>
              *)&this->m_StaleResources,&local_28,Wrapper);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_StaleObjectsMutex);
  return;
}

Assistant:

void SafeReleaseResource(const ResourceWrapperType& Wrapper, Uint64 NextCommandListNumber)
    {
        std::lock_guard<std::mutex> LockGuard(m_StaleObjectsMutex);
        m_StaleResources.emplace_back(NextCommandListNumber, Wrapper);
    }